

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

bool server::searchmodename(char *haystack,char *needle)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  byte bVar4;
  bool bVar5;
  char *pcVar6;
  char cVar7;
  char cVar8;
  byte unaff_R14B;
  byte bVar9;
  
  cVar1 = *needle;
  if (cVar1 == '\0') {
    bVar5 = true;
  }
  else {
    pcVar6 = needle + 1;
    do {
      if (cVar1 != '.') {
        pcVar3 = strchr(haystack,(int)cVar1);
        if (pcVar3 == (char *)0x0) {
          return false;
        }
        haystack = pcVar3 + 1;
      }
      cVar7 = *haystack;
      bVar9 = cVar7 == '\0';
      pcVar3 = pcVar6;
      if ((!(bool)bVar9) && (cVar8 = *pcVar6, pcVar2 = haystack, cVar8 != '\0')) {
        do {
          if (cVar7 == cVar8) {
            pcVar3 = pcVar3 + 1;
          }
          else if (cVar7 != ' ') break;
          cVar7 = pcVar2[1];
          bVar9 = cVar7 == '\0';
          if (((bool)bVar9) || (cVar8 = *pcVar3, pcVar2 = pcVar2 + 1, cVar8 == '\0')) break;
        } while( true );
      }
      bVar4 = 1;
      if (*pcVar3 == '\0') {
        bVar9 = 1;
      }
      else if (*pcVar3 != '.') {
        bVar4 = 0;
        bVar9 = unaff_R14B;
      }
    } while ((cVar1 != '.') && (unaff_R14B = bVar9, bVar4 == 0));
    bVar5 = (bool)(bVar4 & bVar9);
  }
  return bVar5;
}

Assistant:

bool searchmodename(const char *haystack, const char *needle)
    {
        if(!needle[0]) return true;
        do
        {
            if(needle[0] != '.')
            {
                haystack = strchr(haystack, needle[0]);
                if(!haystack) break;
                haystack++;
            }
            const char *h = haystack, *n = needle+1;
            for(; *h && *n; h++)
            {
                if(*h == *n) n++;
                else if(*h != ' ') break;
            }
            if(!*n) return true;
            if(*n == '.') return !*h;
        } while(needle[0] != '.');
        return false;
    }